

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O1

void __thiscall Pda::createDot(Pda *this)

{
  pointer pcVar1;
  pointer ppTVar2;
  string *psVar3;
  long *plVar4;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *pvVar5;
  Node *pNVar6;
  Node *pNVar7;
  long *plVar8;
  pointer ppNVar9;
  _Alloc_hider *p_Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  pointer ppTVar12;
  Pda *pPVar13;
  Pda *this_00;
  pointer ppNVar14;
  pointer __args;
  bool bVar15;
  string to_png;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> used;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string e;
  string s;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> ends;
  string start;
  ofstream file;
  undefined1 local_388 [32];
  _Alloc_hider *local_368;
  long local_360;
  _Alloc_hider local_358;
  long lStack_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> local_328;
  Node **local_308 [2];
  Node *local_2f8 [2];
  long *local_2e8;
  long local_2e0;
  long local_2d8;
  long lStack_2d0;
  long *local_2c8;
  long local_2c0;
  long local_2b8 [2];
  Pda *local_2a8;
  long *local_2a0;
  long local_298;
  long local_290;
  long lStack_288;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  pointer local_248;
  pointer local_240;
  pointer local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,"PDA.dot",_S_out);
  psVar3 = Tjen::Node::getName_abi_cxx11_(this->start);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,pcVar1,pcVar1 + psVar3->_M_string_length);
  local_2c8 = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c8,"digraph {\nrankdir=LR \n","");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388,
                 "invis -> ",&local_268);
  plVar4 = (long *)std::__cxx11::string::append(local_388);
  local_2e8 = &local_2d8;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_2d8 = *plVar8;
    lStack_2d0 = plVar4[3];
  }
  else {
    local_2d8 = *plVar8;
    local_2e8 = (long *)*plVar4;
  }
  local_2e0 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((Pda *)local_388._0_8_ != (Pda *)(local_388 + 0x10)) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
  }
  std::__cxx11::string::append((char *)&local_2c8);
  std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::vector(&local_280,&this->endNodes);
  ppNVar14 = (this->allNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_248 = (this->allNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (ppNVar14 != local_248) {
    do {
      this_00 = (Pda *)*ppNVar14;
      bVar15 = local_280.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
               super__Vector_impl_data._M_start !=
               local_280.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (bVar15) {
        pPVar13 = (Pda *)*local_280.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
        ppNVar9 = local_280.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        while (pPVar13 != this_00) {
          ppNVar9 = ppNVar9 + 1;
          bVar15 = ppNVar9 !=
                   local_280.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl
                   .super__Vector_impl_data._M_finish;
          if (ppNVar9 ==
              local_280.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish) break;
          pPVar13 = (Pda *)*ppNVar9;
        }
      }
      if (bVar15) {
        psVar3 = Tjen::Node::getName_abi_cxx11_((Node *)this_00);
        local_388._0_8_ = local_388 + 0x10;
        pcVar1 = (psVar3->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_388,pcVar1,pcVar1 + psVar3->_M_string_length);
        std::__cxx11::string::append(local_388);
        std::__cxx11::string::_M_append((char *)&local_2c8,local_388._0_8_);
        if ((Pda *)local_388._0_8_ != (Pda *)(local_388 + 0x10)) {
          operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
        }
      }
      local_328.
      super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_328.
      super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (Transition **)0x0;
      local_328.
      super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (Transition **)0x0;
      pPVar13 = this_00;
      local_240 = ppNVar14;
      pvVar5 = Tjen::Node::getTransitions((Node *)this_00);
      __args = (pvVar5->
               super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_238 = (pvVar5->
                  super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      local_2a8 = this_00;
      if (__args != local_238) {
        do {
          bVar15 = checkForTrans(pPVar13,&local_328,*__args);
          if (!bVar15) {
            local_388._0_8_ = local_388 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"[label=\"","");
            pvVar5 = Tjen::Node::getTransitions((Node *)this_00);
            ppTVar2 = (pvVar5->
                      super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            for (ppTVar12 = (pvVar5->
                            super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                            )._M_impl.super__Vector_impl_data._M_start; ppTVar12 != ppTVar2;
                ppTVar12 = ppTVar12 + 1) {
              pNVar6 = Tjen::Node::Transition::getTo(*__args);
              pNVar7 = Tjen::Node::Transition::getTo(*ppTVar12);
              if (pNVar6 == pNVar7) {
                Tjen::Node::Transition::getInput(*__args);
                std::__cxx11::string::push_back((char)local_388);
                std::__cxx11::string::append(local_388);
                Tjen::Node::Transition::getOldStack(*__args);
                std::__cxx11::string::push_back((char)local_388);
                psVar3 = Tjen::Node::Transition::getNewstack_abi_cxx11_(*__args);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_348,"/",psVar3);
                plVar4 = (long *)std::__cxx11::string::append(local_348._M_local_buf);
                p_Var10 = (_Alloc_hider *)(plVar4 + 2);
                if ((_Alloc_hider *)*plVar4 == p_Var10) {
                  local_358._M_p = p_Var10->_M_p;
                  lStack_350 = plVar4[3];
                  local_368 = &local_358;
                }
                else {
                  local_358._M_p = p_Var10->_M_p;
                  local_368 = (_Alloc_hider *)*plVar4;
                }
                local_360 = plVar4[1];
                *plVar4 = (long)p_Var10;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                std::__cxx11::string::_M_append(local_388,(ulong)local_368);
                if (local_368 != &local_358) {
                  operator_delete(local_368,(ulong)(local_358._M_p + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_allocated_capacity != &local_338) {
                  operator_delete((void *)local_348._M_allocated_capacity,
                                  local_338._M_allocated_capacity + 1);
                }
              }
            }
            std::__cxx11::string::append(local_388);
            psVar3 = Tjen::Node::getName_abi_cxx11_((Node *)local_2a8);
            local_308[0] = local_2f8;
            pcVar1 = (psVar3->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_308,pcVar1,pcVar1 + psVar3->_M_string_length);
            std::__cxx11::string::append((char *)local_308);
            pNVar6 = Tjen::Node::Transition::getTo(*__args);
            psVar3 = Tjen::Node::getName_abi_cxx11_(pNVar6);
            plVar4 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_308,(ulong)(psVar3->_M_dataplus)._M_p);
            plVar8 = plVar4 + 2;
            if ((long *)*plVar4 == plVar8) {
              local_290 = *plVar8;
              lStack_288 = plVar4[3];
              local_2a0 = &local_290;
            }
            else {
              local_290 = *plVar8;
              local_2a0 = (long *)*plVar4;
            }
            local_298 = plVar4[1];
            *plVar4 = (long)plVar8;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_2a0,local_388._0_8_);
            local_348._M_allocated_capacity = (size_type)&local_338;
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 == paVar11) {
              local_338._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_338._8_8_ = plVar4[3];
            }
            else {
              local_338._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_348._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar4;
            }
            local_348._8_8_ = plVar4[1];
            *plVar4 = (long)paVar11;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append(local_348._M_local_buf);
            p_Var10 = (_Alloc_hider *)(plVar4 + 2);
            if ((_Alloc_hider *)*plVar4 == p_Var10) {
              local_358._M_p = p_Var10->_M_p;
              lStack_350 = plVar4[3];
              local_368 = &local_358;
            }
            else {
              local_358._M_p = p_Var10->_M_p;
              local_368 = (_Alloc_hider *)*plVar4;
            }
            local_360 = plVar4[1];
            *plVar4 = (long)p_Var10;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_368);
            if (local_368 != &local_358) {
              operator_delete(local_368,(ulong)(local_358._M_p + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_allocated_capacity != &local_338) {
              operator_delete((void *)local_348._M_allocated_capacity,
                              local_338._M_allocated_capacity + 1);
            }
            if (local_2a0 != &local_290) {
              operator_delete(local_2a0,local_290 + 1);
            }
            if (local_308[0] != local_2f8) {
              operator_delete(local_308[0],(ulong)((long)&(local_2f8[0]->name)._M_dataplus._M_p + 1)
                             );
            }
            if (local_328.
                super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_328.
                super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<Tjen::Node::Transition*,std::allocator<Tjen::Node::Transition*>>::
              _M_realloc_insert<Tjen::Node::Transition*const&>
                        ((vector<Tjen::Node::Transition*,std::allocator<Tjen::Node::Transition*>> *)
                         &local_328,
                         (iterator)
                         local_328.
                         super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,__args);
            }
            else {
              *local_328.
               super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
               ._M_impl.super__Vector_impl_data._M_finish = *__args;
              local_328.
              super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_328.
                   super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            pPVar13 = (Pda *)local_388._0_8_;
            this_00 = local_2a8;
            if ((Pda *)local_388._0_8_ != (Pda *)(local_388 + 0x10)) {
              operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
              this_00 = local_2a8;
            }
          }
          __args = __args + 1;
        } while (__args != local_238);
      }
      if (local_328.
          super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_328.
                        super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_328.
                              super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_328.
                              super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      ppNVar14 = local_240 + 1;
    } while (ppNVar14 != local_248);
  }
  local_388._0_8_ = local_388 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_388,local_2e8,local_2e0 + (long)local_2e8);
  std::__cxx11::string::append(local_388);
  std::__cxx11::string::_M_append((char *)&local_2c8,local_388._0_8_);
  if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,(char *)local_2c8,local_2c0);
  std::ofstream::close();
  local_388._0_8_ = local_388 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_388,"dot PDA.dot -Tpng -o PDA.png","");
  system("dot PDA.dot -Tpng -o PDA.png");
  if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
  }
  if (local_280.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_280.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_280.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,local_2d8 + 1);
  }
  if (local_2c8 != local_2b8) {
    operator_delete(local_2c8,local_2b8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Pda::createDot() {

    //file aanmaak en init stuff
    std::ofstream file ("PDA.dot");
    std::string start = this->getStart()->getName();
    std::string s = "digraph {\nrankdir=LR \n";
    std::string e = "invis -> "+ start + " \n";
    s+= "invis [style=invisible] \n";

    //endstates dubbele rand geven
    std::vector<Tjen::Node*> ends = this->getEndNodes();
    for (Tjen::Node* node: this->getAllNodes()) {
        if(checkForNode(ends, node)){
            s+= node->getName() + " [shape=doublecircle] \n";
        }


        //transities toevoegen
        std::vector<Tjen::Node::Transition*> used;
        for (auto& t: node->getTransitions()) {
            if (!checkForTrans(used, t)) {
                std::string label = "[label=\"";
                for (auto &t2: node->getTransitions()) {
                    if (t->getTo() == t2->getTo()) {
                        label += t->getInput();
                        label += ", ";
                        label += t->getOldStack();
                        label += "/" + t->getNewstack() + "\\n";
                    }
                }
                label += "\"]";

                e += node->getName() + " -> " + t->getTo()->getName() + label + "\n";
                used.push_back(t);
            }
        }
    }

    s+=e +"}";
    file << s;
    file.close();

    //convergeer commando
    std::string to_png = "dot PDA.dot -Tpng -o PDA.png";
    system("dot PDA.dot -Tpng -o PDA.png");
}